

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

parser_error parse_always(parser *p)

{
  ulong uVar1;
  long lVar2;
  object_base *poVar3;
  _Bool _Var4;
  wchar_t tval;
  wchar_t wVar5;
  void *pvVar6;
  char *pcVar7;
  object_kind *poVar8;
  class_book_conflict *pcVar9;
  void *pvVar10;
  
  pvVar6 = parser_priv(p);
  pcVar7 = parser_getsym(p,"tval");
  tval = tval_find_idx(pcVar7);
  _Var4 = parser_hasval(p,"sval");
  if (!_Var4) {
    poVar3 = kb_info + tval;
    wVar5 = L'\x01';
    do {
      if (poVar3->num_svals < wVar5) {
        return PARSE_ERROR_NONE;
      }
      poVar8 = lookup_kind(tval,wVar5);
      pcVar9 = object_kind_to_book(poVar8);
      if (pcVar9->dungeon == false) {
        if (*(ulong *)((long)pvVar6 + 0x50) == 0) {
          *(undefined8 *)((long)pvVar6 + 0x48) = 8;
          pvVar10 = mem_zalloc(0x40);
LAB_001c130f:
          *(void **)((long)pvVar6 + 0x58) = pvVar10;
        }
        else {
          uVar1 = *(ulong *)((long)pvVar6 + 0x48);
          pvVar10 = *(void **)((long)pvVar6 + 0x58);
          if (uVar1 <= *(ulong *)((long)pvVar6 + 0x50)) {
            *(ulong *)((long)pvVar6 + 0x48) = uVar1 + 8;
            pvVar10 = mem_realloc(pvVar10,uVar1 * 8 + 0x40);
            goto LAB_001c130f;
          }
        }
        lVar2 = *(long *)((long)pvVar6 + 0x50);
        *(long *)((long)pvVar6 + 0x50) = lVar2 + 1;
        *(object_kind **)((long)pvVar10 + lVar2 * 8) = poVar8;
      }
      wVar5 = wVar5 + L'\x01';
    } while( true );
  }
  pcVar7 = parser_getsym(p,"sval");
  wVar5 = lookup_sval(tval,pcVar7);
  poVar8 = lookup_kind(tval,wVar5);
  if (poVar8 == (object_kind *)0x0) {
    return PARSE_ERROR_UNRECOGNISED_SVAL;
  }
  if (*(ulong *)((long)pvVar6 + 0x50) == 0) {
    *(undefined8 *)((long)pvVar6 + 0x48) = 8;
    pvVar10 = mem_zalloc(0x40);
  }
  else {
    uVar1 = *(ulong *)((long)pvVar6 + 0x48);
    if (*(ulong *)((long)pvVar6 + 0x50) < uVar1) {
      pvVar10 = *(void **)((long)pvVar6 + 0x58);
      goto LAB_001c135c;
    }
    *(ulong *)((long)pvVar6 + 0x48) = uVar1 + 8;
    pvVar10 = mem_realloc(*(void **)((long)pvVar6 + 0x58),uVar1 * 8 + 0x40);
  }
  *(void **)((long)pvVar6 + 0x58) = pvVar10;
LAB_001c135c:
  lVar2 = *(long *)((long)pvVar6 + 0x50);
  *(long *)((long)pvVar6 + 0x50) = lVar2 + 1;
  *(object_kind **)((long)pvVar10 + lVar2 * 8) = poVar8;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_always(struct parser *p) {
	struct store *s = parser_priv(p);
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	struct object_kind *kind = NULL;

	/* Mostly svals are given, but special handling is needed for books */
	if (parser_hasval(p, "sval")) {
		int sval = lookup_sval(tval, parser_getsym(p, "sval"));
		kind = lookup_kind(tval, sval);
		if (!kind) {
			return PARSE_ERROR_UNRECOGNISED_SVAL;
		}

		/* Expand if necessary */
		if (!s->always_num) {
			s->always_size = 8;
			s->always_table = mem_zalloc(s->always_size *
										 sizeof *s->always_table);
		} else if (s->always_num >= s->always_size) {
			s->always_size += 8;
			s->always_table = mem_realloc(s->always_table, s->always_size *
										  sizeof *s->always_table);
		}

		s->always_table[s->always_num++] = kind;
	} else {
		/* Books */
		struct object_base *book_base = &kb_info[tval];
		int i;

		/* Run across all the books for this type, add the town books */
		for (i = 1; i <= book_base->num_svals; i++) {
			const struct class_book *book = NULL;
			kind = lookup_kind(tval, i);
			book = object_kind_to_book(kind);
			if (!book->dungeon) {
				/* Expand if necessary */
				if (!s->always_num) {
					s->always_size = 8;
					s->always_table = mem_zalloc(s->always_size *
												 sizeof *s->always_table);
				} else if (s->always_num >= s->always_size) {
					s->always_size += 8;
					s->always_table = mem_realloc(s->always_table,
												  s->always_size *
												  sizeof *s->always_table);
				}

				s->always_table[s->always_num++] = kind;
			}
		}
	}

	return PARSE_ERROR_NONE;
}